

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O2

void h265_read_vps_rbsp(h265_stream_t *h,bs_t *b)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this;
  vector<int,_std::allocator<int>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  h265_vps_t *__s;
  videoinfo_t *pvVar1;
  pointer pvVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = bs_read_u(b,4);
  __s = h->vps_table[(int)uVar3];
  h->vps = __s;
  uVar6 = 0;
  memset(__s,0,0x4f0);
  __s->vps_video_parameter_set_id = (uint8_t)uVar3;
  uVar3 = bs_read_u1(b);
  __s->vps_base_layer_internal_flag = (uint8_t)uVar3;
  uVar3 = bs_read_u1(b);
  __s->vps_base_layer_available_flag = (uint8_t)uVar3;
  uVar3 = bs_read_u(b,6);
  __s->vps_max_layers_minus1 = (uint8_t)uVar3;
  uVar3 = bs_read_u(b,3);
  __s->vps_max_sub_layers_minus1 = (uint8_t)uVar3;
  uVar3 = bs_read_u1(b);
  __s->vps_temporal_id_nesting_flag = (uint8_t)uVar3;
  uVar3 = bs_read_u(b,0x10);
  __s->vps_reserved_0xffff_16bits = uVar3;
  h265_read_ptl(&__s->ptl,b,1,(uint)__s->vps_max_sub_layers_minus1);
  pvVar1 = h->info;
  pvVar1->profile_idc = (uint)(__s->ptl).general_profile_idc;
  pvVar1->level_idc = (uint)(__s->ptl).general_level_idc;
  pvVar1->tier_idc = (uint)(__s->ptl).general_tier_flag;
  uVar3 = bs_read_u1(b);
  __s->vps_sub_layer_ordering_info_present_flag = (uint8_t)uVar3;
  if (uVar3 == 0) {
    uVar6 = (ulong)__s->vps_max_sub_layers_minus1;
  }
  for (; uVar6 <= __s->vps_max_sub_layers_minus1; uVar6 = uVar6 + 1) {
    uVar3 = bs_read_ue(b);
    __s->vps_max_dec_pic_buffering_minus1[uVar6] = uVar3;
    uVar3 = bs_read_ue(b);
    __s->vps_max_num_reorder_pics[uVar6] = uVar3;
    uVar3 = bs_read_ue(b);
    __s->vps_max_latency_increase_plus1[uVar6] = uVar3;
  }
  uVar3 = bs_read_u(b,6);
  __s->vps_max_layer_id = (uint8_t)uVar3;
  uVar3 = bs_read_ue(b);
  __s->vps_num_layer_sets_minus1 = uVar3;
  this = &__s->layer_id_included_flag;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize(this,(long)(int)(uVar3 + 1));
  uVar4 = 0;
  lVar7 = 0x18;
  while( true ) {
    pvVar2 = (__s->layer_id_included_flag).
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(__s->layer_id_included_flag).
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <=
        (ulong)uVar4) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (pvVar2 + uVar4,(ulong)__s->vps_max_layer_id);
    uVar4 = uVar4 + 1;
  }
  lVar8 = 1;
  while( true ) {
    iVar5 = __s->vps_num_layer_sets_minus1;
    if (iVar5 < lVar8) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(((this->
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data + lVar7),(long)iVar5 + 1);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x18;
  }
  for (lVar7 = 1; lVar7 <= iVar5; lVar7 = lVar7 + 1) {
    for (uVar6 = 0; uVar6 <= __s->vps_max_layer_id; uVar6 = uVar6 + 1) {
      uVar3 = bs_read_u1(b);
      *(char *)(*(long *)&(this->
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar7].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + uVar6) = (char)uVar3;
    }
    iVar5 = __s->vps_num_layer_sets_minus1;
  }
  uVar3 = bs_read_u1(b);
  __s->vps_timing_info_present_flag = (uint8_t)uVar3;
  if (uVar3 != 0) {
    uVar3 = bs_read_u(b,0x20);
    __s->vps_num_units_in_tick = uVar3;
    uVar3 = bs_read_u(b,0x20);
    __s->vps_time_scale = uVar3;
    uVar3 = bs_read_u1(b);
    __s->vps_poc_proportional_to_timing_flag = (uint8_t)uVar3;
    if (uVar3 != 0) {
      uVar3 = bs_read_ue(b);
      __s->vps_num_ticks_poc_diff_one_minus1 = uVar3;
    }
    uVar3 = bs_read_ue(b);
    __s->vps_num_hrd_parameters = uVar3;
    this_00 = &__s->hrd_layer_set_idx;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)uVar3);
    this_01 = &__s->cprms_present_flag;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_01,(long)__s->vps_num_hrd_parameters);
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)__s->vps_num_hrd_parameters);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_01,(long)__s->vps_num_hrd_parameters);
    for (lVar7 = 0; lVar7 < __s->vps_num_hrd_parameters; lVar7 = lVar7 + 1) {
      uVar3 = bs_read_ue(b);
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = uVar3;
      if (lVar7 != 0) {
        uVar3 = bs_read_u1(b);
        (this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar7] = (uchar)uVar3;
      }
      h265_read_hrd_parameters
                (&__s->hrd_parameters,b,
                 (uint)(__s->cprms_present_flag).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7],(uint)__s->vps_max_sub_layers_minus1)
      ;
    }
  }
  uVar3 = bs_read_u1(b);
  __s->vps_extension_flag = (uint8_t)uVar3;
  if (uVar3 != 0) {
    while (b->p < b->end) {
      bs_read_u1(b);
    }
  }
  h265_read_rbsp_trailing_bits(b);
  return;
}

Assistant:

void  h265_read_vps_rbsp(h265_stream_t* h, bs_t* b)
{
    int i = 0;
    int j = 0;

    int vps_video_parameter_set_id  = bs_read_u(b, 4);
    // 选择正确的sps表
    h->vps = h->vps_table[vps_video_parameter_set_id];
    h265_vps_t* vps = h->vps;
    memset(vps, 0, sizeof(h265_vps_t));

    vps->vps_video_parameter_set_id    = vps_video_parameter_set_id;
    vps->vps_base_layer_internal_flag  = bs_read_u1(b);
    vps->vps_base_layer_available_flag = bs_read_u1(b);
    vps->vps_max_layers_minus1         = bs_read_u(b, 6);
    vps->vps_max_sub_layers_minus1     = bs_read_u(b, 3);
    vps->vps_temporal_id_nesting_flag  = bs_read_u1(b);
    vps->vps_reserved_0xffff_16bits    = bs_read_u(b, 16);

    // profile tier level...
    h265_read_ptl(&vps->ptl, b, 1, vps->vps_max_sub_layers_minus1);
    h->info->profile_idc = vps->ptl.general_profile_idc;
    h->info->level_idc   = vps->ptl.general_level_idc;
    h->info->tier_idc    = vps->ptl.general_tier_flag;

    vps->vps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (i = (vps->vps_sub_layer_ordering_info_present_flag ? 0 : vps->vps_max_sub_layers_minus1);
         i <= vps->vps_max_sub_layers_minus1; i++ )
    {
        vps->vps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        vps->vps_max_num_reorder_pics[i]         = bs_read_ue(b);
        vps->vps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }
    vps->vps_max_layer_id           = bs_read_u(b, 6);
    vps->vps_num_layer_sets_minus1  = bs_read_ue(b);
    vps->layer_id_included_flag.resize(vps->vps_num_layer_sets_minus1+1);
    for (unsigned int k = 0; k < vps->layer_id_included_flag.size(); k++)
    {
        vps->layer_id_included_flag[k].resize(vps->vps_max_layer_id);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        vps->layer_id_included_flag[i].resize(vps->vps_num_layer_sets_minus1+1);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        for (j = 0; j <= vps->vps_max_layer_id; j++)
        {
            vps->layer_id_included_flag[i][j] = bs_read_u1(b);
        }
    }
    vps->vps_timing_info_present_flag = bs_read_u1(b);
    if (vps->vps_timing_info_present_flag)
    {
        vps->vps_num_units_in_tick = bs_read_u(b, 32);
        vps->vps_time_scale = bs_read_u(b, 32);
        vps->vps_poc_proportional_to_timing_flag = bs_read_u1(b);
        if (vps->vps_poc_proportional_to_timing_flag)
        {
            vps->vps_num_ticks_poc_diff_one_minus1 = bs_read_ue(b);
        }
        vps->vps_num_hrd_parameters  = bs_read_ue(b);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        for (i = 0; i < vps->vps_num_hrd_parameters; i++)
        {
            vps->hrd_layer_set_idx[i] = bs_read_ue(b);
            if (i > 0)
            {
                vps->cprms_present_flag[i] = bs_read_u1(b);
            }
            //  hrd_parameters()
            h265_read_hrd_parameters(&(vps->hrd_parameters), b, vps->cprms_present_flag[i], vps->vps_max_sub_layers_minus1);
        }
    }
    vps->vps_extension_flag  = bs_read_u1(b);
    if (vps->vps_extension_flag)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}